

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  string_view first_indent;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *x;
  unsigned_long uVar1;
  size_t sVar2;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *pvVar3;
  bool bVar4;
  bool bVar5;
  unsigned_long *puVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  reference pVVar10;
  size_type sVar11;
  reference pvVar12;
  char *pcVar13;
  string_view y;
  string_view y_00;
  size_t local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  string local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  const_iterator local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  string_view local_170;
  reference local_160;
  Value *child_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3_1;
  size_t i;
  undefined1 local_130 [7];
  bool ident_with_name;
  undefined1 local_112;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  iterator local_f0;
  size_type local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  char *local_c8;
  size_type local_c0;
  reference local_b8;
  Value *child_1;
  iterator __end3;
  iterator __begin3;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3;
  string s;
  size_t w;
  Value *child;
  iterator __end2;
  iterator __begin2;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range2;
  unsigned_long uStack_48;
  bool multiline;
  size_t max_width;
  size_t total_width;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *pvStack_30;
  Precedence precedence_local;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args_local;
  Decompiler *this_local;
  string_view prefix_local;
  Value *ml;
  
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (Decompiler *)prefix.data_;
  max_width = 0;
  uStack_48 = 0;
  bVar5 = false;
  total_width._4_4_ = precedence;
  pvStack_30 = args;
  args_local = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)this;
  prefix_local.size_ = (size_type)__return_storage_ptr__;
  __end2 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::begin
                     (args);
  child = (Value *)std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                   end(args);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                                     *)&child), sVar2 = max_width, bVar4) {
    pVVar10 = __gnu_cxx::
              __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
              ::operator*(&__end2);
    s.field_2._8_8_ = Value::width(pVVar10);
    puVar6 = std::max<unsigned_long>
                       (&stack0xffffffffffffffb8,(unsigned_long *)(s.field_2._M_local_buf + 8));
    uStack_48 = *puVar6;
    max_width = s.field_2._8_8_ + max_width;
    bVar4 = !bVar5;
    bVar5 = true;
    if (bVar4) {
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&pVVar10->v);
      bVar5 = 1 < sVar11;
    }
    __gnu_cxx::
    __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
    ::operator++(&__end2);
  }
  if (!bVar5) {
    sVar7 = string_view::size((string_view *)&this_local);
    sVar8 = string_view::size(&postfix);
    if ((sVar2 + sVar7 + sVar8 < this->target_exp_width) ||
       (bVar5 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                empty(pvStack_30), bVar5)) {
      string_view::operator_cast_to_string((string *)&__range3,(string_view *)&this_local);
      pvVar3 = pvStack_30;
      __end3 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::begin
                         (pvStack_30);
      child_1 = (Value *)std::
                         vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                         end(pvVar3);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                                         *)&child_1), bVar5) {
        pVVar10 = __gnu_cxx::
                  __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                  ::operator*(&__end3);
        local_b8 = pVVar10;
        pvVar9 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                 operator[](pvStack_30,0);
        if (pVVar10 != pvVar9) {
          std::__cxx11::string::operator+=((string *)&__range3,", ");
        }
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_b8->v,0);
        std::__cxx11::string::operator+=((string *)&__range3,(string *)pvVar12);
        __gnu_cxx::
        __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
        ::operator++(&__end3);
      }
      local_c8 = postfix.data_;
      local_c0 = postfix.size_;
      y.size_ = (size_type)postfix.data_;
      y.data_ = (char *)postfix.size_;
      operator+=((wabt *)&__range3,(string *)postfix.data_,y);
      std::__cxx11::string::string((string *)&local_110,(string *)&__range3);
      local_f0 = &local_110;
      local_e8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_111);
      __l._M_len = local_e8;
      __l._M_array = local_f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e0,__l,&local_111);
      Value::Value(__return_storage_ptr__,&local_e0,total_width._4_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_111);
      local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
      do {
        local_220 = local_220 + -1;
        std::__cxx11::string::~string((string *)local_220);
      } while (local_220 != &local_110);
      std::__cxx11::string::~string((string *)&__range3);
      return __return_storage_ptr__;
    }
  }
  local_112 = 0;
  memset(local_130,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130);
  Value::Value(__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_130,total_width._4_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  uVar1 = uStack_48;
  sVar7 = string_view::size((string_view *)&this_local);
  pvVar3 = pvStack_30;
  bVar5 = this->target_exp_width <= uVar1 + sVar7;
  __range3_1 = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)0x0;
  __end3_1 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::begin
                       (pvStack_30);
  child_2 = (Value *)std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ::end(pvVar3);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                             *)&child_2), bVar4) {
    pVVar10 = __gnu_cxx::
              __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
              ::operator*(&__end3_1);
    local_160 = pVVar10;
    if (bVar5) {
      local_248 = this->indent_amount;
    }
    else {
      local_248 = string_view::size((string_view *)&this_local);
    }
    if ((__range3_1 !=
         (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)0x0) ||
       (bVar5)) {
      string_view::string_view(&local_170);
    }
    else {
      local_170.data_ = (char *)this_local;
      local_170.size_ = (size_type)prefix_local.data_;
    }
    first_indent.size_ = local_170.size_;
    first_indent.data_ = local_170.data_;
    IndentValue(this,pVVar10,local_248,first_indent);
    sVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::size
                       (pvStack_30);
    if (__range3_1 <
        (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)(sVar11 - 1)) {
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back(&local_160->v);
      std::__cxx11::string::operator+=((string *)pvVar12,",");
    }
    local_178._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_160->v);
    local_180._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_160->v);
    local_188 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             (&__return_storage_ptr__->v);
    local_190 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (local_178,local_180,
                              (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_188);
    __range3_1 = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 ((long)&(__range3_1->
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
    ::operator++(&__end3_1);
  }
  if (bVar5) {
    local_1a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&__return_storage_ptr__->v);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_198,&local_1a0);
    string_view::operator_cast_to_string(&local_1c0,(string_view *)&this_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&__return_storage_ptr__->v,local_198,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  x = postfix.data_;
  sVar7 = postfix.size_;
  pcVar13 = postfix.data_;
  pvVar12 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::back(&__return_storage_ptr__->v);
  y_00.size_ = (size_type)pcVar13;
  y_00.data_ = (char *)sVar7;
  operator+=((wabt *)pvVar12,(string *)x,y_00);
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args, string_view prefix,
                 string_view postfix, Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml { {}, precedence };
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : string_view {});
        if (i < args.size() - 1) child.v.back() += ",";
        std::move(child.v.begin(), child.v.end(),
                  std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) ml.v.insert(ml.v.begin(), std::string(prefix));
      ml.v.back() += postfix;
      return ml;
    }
  }